

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

Matrix4x4 * __thiscall CGL::Matrix4x4::operator*(Matrix4x4 *this,Matrix4x4 *B)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Matrix4x4 *pMVar5;
  int i;
  long lVar6;
  Matrix4x4 *C;
  Matrix4x4 *in_RDI;
  long lVar7;
  
  pMVar5 = in_RDI;
  in_RDI->entries[3].field_0.field_0.x = 0.0;
  in_RDI->entries[3].field_0.field_0.y = 0.0;
  in_RDI->entries[3].field_0.field_0.z = 0.0;
  in_RDI->entries[3].field_0.field_0.w = 0.0;
  in_RDI->entries[2].field_0.field_0.x = 0.0;
  in_RDI->entries[2].field_0.field_0.y = 0.0;
  in_RDI->entries[2].field_0.field_0.z = 0.0;
  in_RDI->entries[2].field_0.field_0.w = 0.0;
  in_RDI->entries[1].field_0.field_0.x = 0.0;
  in_RDI->entries[1].field_0.field_0.y = 0.0;
  in_RDI->entries[1].field_0.field_0.z = 0.0;
  in_RDI->entries[1].field_0.field_0.w = 0.0;
  in_RDI->entries[0].field_0.field_0.x = 0.0;
  in_RDI->entries[0].field_0.field_0.y = 0.0;
  in_RDI->entries[0].field_0.field_0.z = 0.0;
  in_RDI->entries[0].field_0.field_0.w = 0.0;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    dVar1 = this->entries[lVar6].field_0.field_0.x;
    dVar2 = this->entries[lVar6].field_0.field_0.y;
    dVar3 = this->entries[lVar6].field_0.field_0.z;
    dVar4 = this->entries[lVar6].field_0.field_0.w;
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x20) {
      *(double *)((long)&in_RDI->entries[0].field_0 + lVar7) =
           dVar4 * *(double *)((long)&B->entries[0].field_0 + lVar7 + 0x18) +
           dVar3 * *(double *)((long)&B->entries[0].field_0 + lVar7 + 0x10) +
           dVar1 * *(double *)((long)&B->entries[0].field_0 + lVar7) +
           dVar2 * *(double *)((long)&B->entries[0].field_0 + lVar7 + 8);
    }
    in_RDI = (Matrix4x4 *)((long)&in_RDI->entries[0].field_0 + 8);
  }
  return pMVar5;
}

Assistant:

Matrix4x4 Matrix4x4::operator*(const Matrix4x4 &B) const {
  const Matrix4x4 &A(*this);
  Matrix4x4 C;

  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
#ifdef __AVX__
      C(i, j) = dot(A[i], Vector4D(B(0, j), B(1, j), B(2, j), B(3, j)));
#else
      C(i, j) = 0.;

      for (int k = 0; k < 4; k++) {
        C(i, j) += A(i, k) * B(k, j);
      }
#endif
    }
  }

  return C;
}